

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O1

QpVector * __thiscall
Basis::Ztprod(Basis *this,QpVector *rhs,QpVector *target,bool buffer,HighsInt q)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  
  ftran(this,rhs,&this->Ztprod_res,buffer,q);
  if (0 < target->num_nz) {
    piVar2 = (target->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      pdVar3[piVar2[lVar7]] = 0.0;
      piVar2[lVar7] = 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 < target->num_nz);
  }
  target->num_nz = 0;
  piVar2 = (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar7 = (long)(this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 2;
    piVar4 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar5 = (target->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->Ztprod_res).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      iVar1 = piVar4[piVar2[lVar8]];
      piVar5[lVar8] = (int)lVar8;
      pdVar3[lVar8] = pdVar6[iVar1];
      lVar8 = lVar8 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
  }
  QpVector::resparsify(target);
  return target;
}

Assistant:

QpVector& Basis::Ztprod(const QpVector& rhs, QpVector& target, bool buffer,
                        HighsInt q) {
  ftran(rhs, Ztprod_res, buffer, q);

  target.reset();
  for (size_t i = 0; i < non_active_constraint_index.size(); i++) {
    HighsInt nonactive = non_active_constraint_index[i];
    HighsInt idx = constraintindexinbasisfactor[nonactive];
    target.index[i] = static_cast<HighsInt>(i);
    target.value[i] = Ztprod_res.value[idx];
  }
  target.resparsify();
  return target;
}